

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void test_br(void)

{
  _Atomic_word *p_Var1;
  int iVar2;
  shared_ptr<vmips::Function> f;
  shared_ptr<vmips::VirtReg> zero;
  shared_ptr<vmips::VirtReg> r4;
  shared_ptr<vmips::VirtReg> r0;
  shared_ptr<vmips::VirtReg> r1;
  shared_ptr<vmips::VirtReg> ret;
  shared_ptr<vmips::VirtReg> val;
  shared_ptr<vmips::VirtReg> r3;
  shared_ptr<vmips::CFGNode> c;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> br2;
  shared_ptr<vmips::VirtReg> r2;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> br1;
  shared_ptr<vmips::VirtReg> mm;
  Function *local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  shared_ptr<vmips::VirtReg> local_190;
  shared_ptr<vmips::VirtReg> local_180;
  shared_ptr<vmips::VirtReg> local_170;
  shared_ptr<vmips::VirtReg> local_160;
  shared_ptr<vmips::VirtReg> local_150;
  undefined4 local_140;
  shared_ptr<vmips::VirtReg> local_130;
  CFGNode local_120 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  shared_ptr<vmips::VirtReg> local_110;
  shared_ptr local_100 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> local_f0;
  CFGNode local_d0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> local_c0;
  CFGNode local_a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  CFGNode local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  CFGNode local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  CFGNode local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  CFGNode local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  shared_ptr local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  CFGNode local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  CFGNode local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_c0.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 2;
  local_1a0 = (Function *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vmips::Function,std::allocator<vmips::Function>,char_const(&)[5],int>
            (&local_198,&local_1a0,(allocator<vmips::Function> *)&local_f0,(char (*) [5])"test",
             (int *)&local_c0);
  vmips::Function::entry();
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  vmips::get_special((SpecialReg)&local_190);
  local_c0.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
  vmips::CFGNode::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((CFGNode *)&local_170,*(shared_ptr<vmips::VirtReg> **)(local_1a0 + 0x148),
             (int *)&local_190);
  local_c0.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
  vmips::CFGNode::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((CFGNode *)&local_150,*(shared_ptr<vmips::VirtReg> **)(local_1a0 + 0x148),
             (int *)&local_190);
  vmips::Function::
  branch<vmips::beq,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (&local_c0,local_1a0,&local_170,&local_150);
  local_f0.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
  vmips::CFGNode::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            (local_d0,*(shared_ptr<vmips::VirtReg> **)(local_1a0 + 0x148),(int *)&local_190);
  vmips::Function::
  branch<vmips::beq,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (&local_f0,local_1a0,&local_190,&local_190);
  local_140 = 1;
  vmips::CFGNode::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            (local_30,*(shared_ptr<vmips::VirtReg> **)(local_1a0 + 0x148),(int *)&local_190);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  vmips::Function::switch_to(local_1a0);
  local_140 = 1;
  vmips::CFGNode::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            (local_40,*(shared_ptr<vmips::VirtReg> **)(local_1a0 + 0x148),(int *)&local_190);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  vmips::Function::join(local_100,local_1a0);
  vmips::Function::switch_to(local_1a0);
  local_140 = 2;
  vmips::CFGNode::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((CFGNode *)&local_110,*(shared_ptr<vmips::VirtReg> **)(local_1a0 + 0x148),
             (int *)&local_190);
  vmips::CFGNode::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((CFGNode *)&local_180,*(shared_ptr<vmips::VirtReg> **)(local_1a0 + 0x148),&local_110);
  vmips::CFGNode::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (local_a0,*(shared_ptr<vmips::VirtReg> **)(local_1a0 + 0x148),&local_170);
  vmips::Function::join(local_50,local_1a0);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  vmips::Function::add_phi(local_1a0,local_d0);
  vmips::CFGNode::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (local_60,*(shared_ptr<vmips::VirtReg> **)(local_1a0 + 0x148),&local_180);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  local_140 = 4;
  vmips::CFGNode::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            (local_70,*(shared_ptr<vmips::VirtReg> **)(local_1a0 + 0x148),(int *)&local_180);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  vmips::CFGNode::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (local_80,*(shared_ptr<vmips::VirtReg> **)(local_1a0 + 0x148),&local_180);
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  vmips::CFGNode::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (local_120,*(shared_ptr<vmips::VirtReg> **)(local_1a0 + 0x148),&local_150);
  local_160.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1a0;
  local_160.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_198._M_pi;
  if (local_198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_198._M_pi)->_M_weak_count = (local_198._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_198._M_pi)->_M_weak_count = (local_198._M_pi)->_M_weak_count + 1;
    }
  }
  vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
            ((Function *)&local_130,(weak_ptr<vmips::Function> *)local_1a0,&local_160);
  if (local_160.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_160.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_160.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_weak_count;
      (local_160.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_160.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_vptr__Sp_counted_base[3])();
    }
  }
  vmips::CFGNode::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (local_90,*(shared_ptr<vmips::VirtReg> **)(local_1a0 + 0x148),&local_130);
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  vmips::Function::output((ostream *)local_1a0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  vmips::Function::color();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  vmips::Function::output((ostream *)local_1a0);
  vmips::Function::scan_overlap();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  vmips::Function::output((ostream *)local_1a0);
  vmips::Function::handle_alloca();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  vmips::Function::output((ostream *)local_1a0);
  if (local_130.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (local_180.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_180.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_110.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (local_f0.second.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.second.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_f0.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  if (local_c0.second.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.second.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c0.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_170.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_190.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198._M_pi);
  }
  return;
}

Assistant:

void test_br() {
    auto f  = std::make_shared<Function>("test", 2);
    f->entry();
    auto zero = get_special(SpecialReg::zero);;
    auto r0 = f->append<addi>(zero, 1);
    auto r1 = f->append<addi>(zero, 1);
    auto br1 = f->branch<beq>(r0, r1);

    //branch 1
    auto r2 = f->append<addi>(zero, 1);
    auto br2 = f->branch<beq>(zero, zero);

    //branch 11
    f->append<addi>(zero, 1);

    //branch 12
    f->switch_to(br2.second);
    f->append<addi>(zero, 1);

    auto c = f->join(br2.first, br2.second);

    //branch 2
    f->switch_to(br1.second);
    auto r3 = f->append<addi>(zero, 2);
    auto r4 = f->append<add>(r3, r3);
    auto mm = f->append<add>(r0, r0);

    f->join(c, br1.second);
    f->add_phi(r2, r4);
    f->append<add>(r4, r4);
    f->append<addi>(r4, 4);
    f->append<add>(r4, r0);
    auto val = f->append<add>(r1, r0);
    auto ret = f->call(f, val);
    f->append<add>(ret, ret);
    f->output(std::cout);
    std::cout << std::endl;
    f->color();
    std::cout << std::endl;
    f->output(std::cout);
    f->scan_overlap();
    std::cout << std::endl;
    f->output(std::cout);
    f->handle_alloca();
    std::cout << std::endl;
    f->output(std::cout);

}